

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transaction.cpp
# Opt level: O0

void __thiscall
Transaction_GetRoInt_Test::~Transaction_GetRoInt_Test(Transaction_GetRoInt_Test *this)

{
  Transaction_GetRoInt_Test *this_local;
  
  ~Transaction_GetRoInt_Test(this);
  operator_delete(this,0x1e0);
  return;
}

Assistant:

TEST_F (Transaction, GetRoInt) {
    // First setup the mock expectations.
    EXPECT_CALL (db_, get (pstore::address::null (), sizeof (int), true, false))
        .WillOnce (::testing::Invoke (&db_, &mock_database::base_get));

    // Now the real body of the test
    {
        mock_mutex mutex;
        auto transaction = begin (db_, std::unique_lock<mock_mutex>{mutex});
        db_.getro (pstore::typed_address<int>::null (), 1);
        transaction.commit ();
    }
}